

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O0

natwm_error workspace_list_send_to_workspace(natwm_state *state,client *client,size_t index)

{
  workspace *workspace;
  workspace *workspace_00;
  monitor *monitor;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar1;
  monitor *next_monitor;
  natwm_error err;
  workspace *client_workspace;
  workspace *next_workspace;
  size_t index_local;
  client *client_local;
  natwm_state *state_local;
  
  uVar1 = 0x10ddc9;
  workspace = workspace_list_get_workspace(state->workspace_list,index);
  if (workspace == (workspace *)0x0) {
    internal_logger(natwm_logger,LEVEL_WARNING,
                    "Attempting to move window to non-existent workspace %u",index,in_R8,in_R9,uVar1
                   );
    state_local._4_4_ = INVALID_INPUT_ERROR;
  }
  else if ((workspace->is_focused & 1U) == 0) {
    workspace_00 = workspace_list_find_client_workspace(state->workspace_list,client);
    if (workspace_00 == (workspace *)0x0) {
      internal_logger(natwm_logger,LEVEL_ERROR,
                      "Failed to find current workspace when moving client to new workspace");
      state_local._4_4_ = RESOLUTION_FAILURE;
    }
    else {
      client_hide(state,client);
      state_local._4_4_ = workspace_remove_client(state,workspace_00,client);
      if (state_local._4_4_ == NO_ERROR) {
        state_local._4_4_ = workspace_add_client(state,workspace,client);
        if (state_local._4_4_ == NO_ERROR) {
          if ((workspace->is_visible & 1U) == 0) {
            state_local._4_4_ = NO_ERROR;
          }
          else {
            monitor = monitor_list_get_workspace_monitor(state->monitor_list,workspace);
            if (monitor == (monitor *)0x0) {
              internal_logger(natwm_logger,LEVEL_ERROR,
                              "Failed to find workspace monitor when sending client to workspace");
              state_local._4_4_ = RESOLUTION_FAILURE;
            }
            else {
              client_show(state,monitor,client);
              state_local._4_4_ = NO_ERROR;
            }
          }
        }
        else {
          internal_logger(natwm_logger,LEVEL_ERROR,"Failed to add client to workspace");
        }
      }
      else {
        internal_logger(natwm_logger,LEVEL_ERROR,
                        "Failed to remove client from current workspace while moving client to new workspace"
                       );
      }
    }
  }
  else {
    state_local._4_4_ = NO_ERROR;
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error workspace_list_send_to_workspace(struct natwm_state *state, struct client *client,
                                                  size_t index)
{
        struct workspace *next_workspace
                = workspace_list_get_workspace(state->workspace_list, index);

        if (!next_workspace) {
                LOG_WARNING(natwm_logger,
                            "Attempting to move window to non-existent "
                            "workspace %u",
                            index);

                return INVALID_INPUT_ERROR;
        }

        if (next_workspace->is_focused) {
                return NO_ERROR;
        }

        struct workspace *client_workspace
                = workspace_list_find_client_workspace(state->workspace_list, client);

        if (!client_workspace) {
                LOG_ERROR(natwm_logger,
                          "Failed to find current workspace when moving "
                          "client to new workspace");

                return RESOLUTION_FAILURE;
        }

        enum natwm_error err = GENERIC_ERROR;

        client_hide(state, client);

        err = workspace_remove_client(state, client_workspace, client);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger,
                          "Failed to remove client from current workspace "
                          "while moving client to new workspace");

                return err;
        }

        err = workspace_add_client(state, next_workspace, client);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Failed to add client to workspace");

                return err;
        }

        // If the next workspace is not on a visible monitor we are done
        if (!next_workspace->is_visible) {
                return NO_ERROR;
        }

        // Otherwise we need to map the client on the next monitor
        struct monitor *next_monitor
                = monitor_list_get_workspace_monitor(state->monitor_list, next_workspace);

        if (!next_monitor) {
                LOG_ERROR(natwm_logger,
                          "Failed to find workspace monitor when sending "
                          "client to workspace");

                return RESOLUTION_FAILURE;
        }

        client_show(state, next_monitor, client);

        return NO_ERROR;
}